

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsXMLReader.cxx
# Opt level: O3

string * __thiscall
kws::XMLReader::GetValue(string *__return_storage_ptr__,XMLReader *this,string *tag)

{
  pointer pcVar1;
  int iVar2;
  string tagt;
  string local_70;
  string local_50;
  
  this->m_CurrentPos = 0;
  GetTag_abi_cxx11_(&local_70,this);
  if (local_70._M_string_length != 0) {
    do {
      iVar2 = strcmp(local_70._M_dataplus._M_p,(tag->_M_dataplus)._M_p);
      if (iVar2 == 0) break;
      GetTag_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while (local_70._M_string_length != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_Value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_Value)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XMLReader::GetValue(std::string tag)
{
  m_CurrentPos = 0;
  std::string tagt = this->GetTag();
  while((tagt.length()>0)  && (strcmp(tagt.c_str(),tag.c_str())))
    {
    tagt = this->GetTag();
    }

  return m_Value;
}